

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O0

void __thiscall
amrex::ErrorRec::ErrorRec(ErrorRec *this,string *nm,int ng,ErrorType etyp,ErrorFunc *f)

{
  undefined8 uVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  
  *in_RDI = &PTR__ErrorRec_01aa40e0;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  *(undefined4 *)(in_RDI + 5) = in_EDX;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_ECX;
  uVar1 = (**(code **)*in_R8)();
  in_RDI[6] = uVar1;
  in_RDI[7] = 0;
  return;
}

Assistant:

ErrorRec::ErrorRec (const std::string&         nm,
                    int                        ng,
                    ErrorRec::ErrorType        etyp,
                    const ErrorRec::ErrorFunc& f)
    :
    derive_name(nm),
    ngrow(ng),
    err_type(etyp),
    err_func(f.clone()),
    err_func2(0)
{}